

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounded_utf8_length_sequence.h
# Opt level: O1

uint32_t __thiscall
absl::lts_20240722::debugging_internal::BoundedUtf8LengthSequence<256U>::
InsertAndReturnSumOfPredecessors
          (BoundedUtf8LengthSequence<256U> *this,uint32_t index,uint32_t utf8_length)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint64_t *puVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int local_50;
  
  uVar3 = 0xff;
  if (index < 0xff) {
    uVar3 = (ulong)index;
  }
  uVar1 = uVar3 >> 5;
  bVar6 = (char)uVar3 * '\x02' & 0x3e;
  uVar12 = -1L << bVar6;
  uVar7 = ~uVar12;
  uVar4 = this->rep_[uVar1] & uVar7;
  uVar8 = uVar4 - (uVar4 >> 1 & 0x1555555555555555);
  uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
  uVar8 = ((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  uVar5 = uVar8 >> 0x38;
  uVar2 = (uint)(byte)(uVar8 >> 0x38);
  uVar4 = (uVar4 & 0x2aaaaaaaaaaaaaaa) - ((uVar4 & 0x2aaaaaaaaaaaaaaa) >> 1);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  uVar8 = uVar4 >> 0x38;
  uVar10 = (uint)(byte)(uVar4 >> 0x38);
  if (0x1f < index) {
    puVar11 = this->rep_ + ((int)uVar1 - 1);
    uVar4 = uVar1;
    do {
      uVar14 = *puVar11;
      uVar9 = uVar14 - (uVar14 >> 1 & 0x5555555555555555);
      uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
      uVar2 = (int)uVar5 +
              (uint)(byte)(((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      uVar5 = (ulong)uVar2;
      uVar14 = (uVar14 & 0xaaaaaaaaaaaaaaaa) - ((uVar14 & 0xaaaaaaaaaaaaaaaa) >> 1);
      uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
      uVar10 = (int)uVar8 +
               (uint)(byte)(((uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38
                           );
      uVar8 = (ulong)uVar10;
      puVar11 = puVar11 + -1;
      uVar13 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar13;
    } while (uVar13 != 0);
  }
  if ((int)uVar1 != 7) {
    uVar4 = 7;
    do {
      this->rep_[uVar4] = this->rep_[uVar4] << 2 | this->rep_[uVar4 - 1] >> 0x3e;
      uVar4 = uVar4 - 1;
    } while (uVar1 < uVar4);
  }
  local_50 = (int)uVar3;
  uVar3 = 0;
  if (0xfffffffb < utf8_length - 5) {
    uVar3 = (ulong)(utf8_length - 1);
  }
  this->rep_[uVar1] = (uVar12 & this->rep_[uVar1]) << 2 | uVar3 << bVar6 | uVar7 & this->rep_[uVar1]
  ;
  return uVar2 + local_50 + uVar10;
}

Assistant:

uint32_t InsertAndReturnSumOfPredecessors(
      uint32_t index, uint32_t utf8_length) {
    // The caller shouldn't pass out-of-bounds inputs, but if it does happen,
    // clamp the values and try to continue.  If we're being called from a
    // signal handler, the last thing we want to do is crash.  Emitting
    // malformed UTF-8 is a lesser evil.
    if (index >= max_elements) index = max_elements - 1;
    if (utf8_length == 0 || utf8_length > 4) utf8_length = 1;

    const uint32_t word_index = index/32;
    const uint32_t bit_index = 2 * (index % 32);
    const uint64_t ones_bit = uint64_t{1} << bit_index;

    // Compute the sum of predecessors.
    //   - Each value from 1 to 4 is represented by a bit field with value from
    //     0 to 3, so the desired sum is index plus the sum of the
    //     representations actually stored.
    //   - For each bit field, a set low bit should contribute 1 to the sum, and
    //     a set high bit should contribute 2.
    //   - Another way to say the same thing is that each set bit contributes 1,
    //     and each set high bit contributes an additional 1.
    //   - So the sum we want is index + popcount(everything) + popcount(bits in
    //     odd positions).
    const uint64_t odd_bits_mask = 0xaaaaaaaaaaaaaaaa;
    const uint64_t lower_seminibbles_mask = ones_bit - 1;
    const uint64_t higher_seminibbles_mask = ~lower_seminibbles_mask;
    const uint64_t same_word_bits_below_insertion =
        rep_[word_index] & lower_seminibbles_mask;
    int full_popcount = absl::popcount(same_word_bits_below_insertion);
    int odd_popcount =
        absl::popcount(same_word_bits_below_insertion & odd_bits_mask);
    for (uint32_t j = word_index; j > 0; --j) {
      const uint64_t word_below_insertion = rep_[j - 1];
      full_popcount += absl::popcount(word_below_insertion);
      odd_popcount += absl::popcount(word_below_insertion & odd_bits_mask);
    }
    const uint32_t sum_of_predecessors =
        index + static_cast<uint32_t>(full_popcount + odd_popcount);

    // Now insert utf8_length's representation, shifting successors up one
    // place.
    for (uint32_t j = max_elements/32 - 1; j > word_index; --j) {
      rep_[j] = (rep_[j] << 2) | (rep_[j - 1] >> 62);
    }
    rep_[word_index] =
        (rep_[word_index] & lower_seminibbles_mask) |
        (uint64_t{utf8_length - 1} << bit_index) |
        ((rep_[word_index] & higher_seminibbles_mask) << 2);

    return sum_of_predecessors;
  }